

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void ZopfliLengthsToSymbols(uint *lengths,size_t n,uint maxbits,uint *symbols)

{
  undefined8 *__s;
  void *__ptr;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(maxbits + 1);
  __s = (undefined8 *)malloc(uVar2 * 8);
  __ptr = malloc(uVar2 * 8);
  if (n == 0) {
    memset(__s,0,(uVar2 + (uVar2 == 0)) * 8);
  }
  else {
    uVar1 = 0;
    do {
      symbols[uVar1] = 0;
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < n);
    uVar1 = 0;
    memset(__s,0,(uVar2 + (uVar2 == 0)) * 8);
    do {
      __s[lengths[uVar1]] = __s[lengths[uVar1]] + 1;
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < n);
  }
  *__s = 0;
  if (maxbits != 0) {
    uVar1 = 2;
    if (2 < maxbits + 1) {
      uVar1 = uVar2;
    }
    lVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = ((uVar2 & 0xffffffff) + __s[lVar3]) * 2;
      *(ulong *)((long)__ptr + lVar3 * 8 + 8) = uVar2 & 0xffffffff;
      lVar3 = lVar3 + 1;
    } while (uVar1 - 1 != lVar3);
  }
  if (n != 0) {
    uVar2 = 0;
    do {
      uVar1 = (ulong)lengths[uVar2];
      if (uVar1 != 0) {
        lVar3 = *(long *)((long)__ptr + uVar1 * 8);
        symbols[uVar2] = (uint)lVar3;
        *(long *)((long)__ptr + uVar1 * 8) = lVar3 + 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < n);
  }
  free(__s);
  free(__ptr);
  return;
}

Assistant:

void ZopfliLengthsToSymbols(const unsigned* lengths, size_t n, unsigned maxbits,
                            unsigned* symbols) {
  size_t* bl_count = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  size_t* next_code = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  unsigned bits, i;
  unsigned code;

  for (i = 0; i < n; i++) {
    symbols[i] = 0;
  }

  /* 1) Count the number of codes for each code length. Let bl_count[N] be the
  number of codes of length N, N >= 1. */
  for (bits = 0; bits <= maxbits; bits++) {
    bl_count[bits] = 0;
  }
  for (i = 0; i < n; i++) {
    assert(lengths[i] <= maxbits);
    bl_count[lengths[i]]++;
  }
  /* 2) Find the numerical value of the smallest code for each code length. */
  code = 0;
  bl_count[0] = 0;
  for (bits = 1; bits <= maxbits; bits++) {
    code = (code + bl_count[bits-1]) << 1;
    next_code[bits] = code;
  }
  /* 3) Assign numerical values to all codes, using consecutive values for all
  codes of the same length with the base values determined at step 2. */
  for (i = 0;  i < n; i++) {
    unsigned len = lengths[i];
    if (len != 0) {
      symbols[i] = next_code[len];
      next_code[len]++;
    }
  }

  free(bl_count);
  free(next_code);
}